

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

int xmlFileRead(void *context,char *buffer,int len)

{
  int iVar1;
  xmlParserErrors xVar2;
  int *piVar3;
  size_t sVar4;
  
  if (buffer == (char *)0x0 || context == (void *)0x0) {
    sVar4 = 0xffffffffffffffff;
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0;
    sVar4 = fread(buffer,1,(long)len,(FILE *)context);
    if (sVar4 < (ulong)(long)len) {
      iVar1 = ferror((FILE *)context);
      if (iVar1 != 0) {
        xVar2 = xmlIOErr(*piVar3);
        sVar4 = (size_t)-xVar2;
      }
    }
  }
  return (int)sVar4;
}

Assistant:

int
xmlFileRead(void * context, char * buffer, int len) {
    FILE *file = context;
    size_t bytes;

    if ((context == NULL) || (buffer == NULL))
        return(-1);

    /*
     * The C standard doesn't mandate that fread sets errno, only
     * POSIX does. The Windows documentation isn't really clear.
     * Set errno to zero which will be reported as unknown error
     * if fread fails without setting errno.
     */
    errno = 0;
    bytes = fread(buffer, 1, len, file);
    if ((bytes < (size_t) len) && (ferror(file)))
        return(-xmlIOErr(errno));

    return(bytes);
}